

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double extreme_values_sample(double a,double b,int *seed)

{
  double dVar1;
  double x;
  double cdf;
  int *seed_local;
  double b_local;
  double a_local;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = extreme_values_cdf_inv(dVar1,a,b);
  return dVar1;
}

Assistant:

double extreme_values_sample ( double a, double b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    EXTREME_VALUES_SAMPLE samples the Extreme Values PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double EXTREME_VALUES_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = extreme_values_cdf_inv ( cdf, a, b );

  return x;
}